

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_is_container_mark
              (MD_CTX *ctx,uint indent,MD_OFFSET beg,MD_OFFSET *p_end,MD_CONTAINER *p_container)

{
  char cVar1;
  MD_CHAR *pMVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar9 = ctx->size;
  if (uVar9 <= beg) {
    return 0;
  }
  if (ctx->code_indent_offset <= indent) {
    return 0;
  }
  pMVar2 = ctx->text;
  uVar7 = (ulong)beg;
  cVar1 = pMVar2[uVar7];
  if (cVar1 != '\0') {
    if (cVar1 == '>') {
      p_container->ch = '>';
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar9 = indent + 1;
      uVar6 = (ulong)(beg + 1);
      goto LAB_00531af4;
    }
    pvVar4 = memchr("-+*",(int)cVar1,4);
    if ((pvVar4 != (void *)0x0) &&
       ((uVar6 = uVar7 + 1, uVar9 <= (uint)uVar6 ||
        (((ulong)(byte)pMVar2[uVar6] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)pMVar2[uVar6] & 0x3f) & 1) != 0)))))) {
      p_container->ch = cVar1;
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar9 = indent + 1;
      goto LAB_00531af4;
    }
  }
  uVar3 = beg + 9;
  if (uVar9 <= beg + 9) {
    uVar3 = uVar9;
  }
  p_container->start = 0;
  uVar8 = uVar3;
  if (uVar3 < beg) {
    uVar8 = beg;
  }
  uVar5 = 0;
  for (; uVar7 < uVar3; uVar7 = uVar7 + 1) {
    if (9 < (byte)(pMVar2[uVar7] - 0x30U)) {
      uVar8 = (uint)uVar7;
      break;
    }
    uVar5 = (uVar5 * 10 + (uint)(byte)pMVar2[uVar7]) - 0x30;
    p_container->start = uVar5;
  }
  if (uVar9 <= uVar8 || uVar8 <= beg) {
    return 0;
  }
  cVar1 = pMVar2[uVar8];
  if ((cVar1 != '.') && (cVar1 != ')')) {
    return 0;
  }
  uVar6 = (ulong)uVar8 + 1;
  if ((uint)uVar6 < uVar9) {
    if (0x20 < (ulong)(byte)pMVar2[uVar6]) {
      return 0;
    }
    if ((0x100002600U >> ((ulong)(byte)pMVar2[uVar6] & 0x3f) & 1) == 0) {
      return 0;
    }
  }
  p_container->ch = cVar1;
  *(undefined2 *)&p_container->field_0x1 = 0;
  p_container->mark_indent = indent;
  uVar9 = (indent - beg) + uVar8 + 1;
LAB_00531af4:
  p_container->contents_indent = uVar9;
  *p_end = (MD_OFFSET)uVar6;
  return 1;
}

Assistant:

static int
md_is_container_mark(MD_CTX* ctx, unsigned indent, OFF beg, OFF* p_end, MD_CONTAINER* p_container)
{
    OFF off = beg;
    OFF max_end;

    if(off >= ctx->size  ||  indent >= ctx->code_indent_offset)
        return FALSE;

    /* Check for block quote mark. */
    if(CH(off) == _T('>')) {
        off++;
        p_container->ch = _T('>');
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off;
        return TRUE;
    }

    /* Check for list item bullet mark. */
    if(ISANYOF(off, _T("-+*"))  &&  (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1))) {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off+1;
        return TRUE;
    }

    /* Check for ordered list item marks. */
    max_end = off + 9;
    if(max_end > ctx->size)
        max_end = ctx->size;
    p_container->start = 0;
    while(off < max_end  &&  ISDIGIT(off)) {
        p_container->start = p_container->start * 10 + CH(off) - _T('0');
        off++;
    }
    if(off > beg  &&
       off < ctx->size  &&
       (CH(off) == _T('.') || CH(off) == _T(')'))  &&
       (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1)))
    {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + off - beg + 1;
        *p_end = off+1;
        return TRUE;
    }

    return FALSE;
}